

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O2

void __thiscall Hand::getHigherFinger(Hand *this)

{
  int iVar1;
  pointer pFVar2;
  int iVar3;
  Finger *f;
  pointer pFVar4;
  Finger hf;
  
  Finger::Finger(&hf);
  pFVar2 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar3 = -1;
  for (pFVar4 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                super__Vector_impl_data._M_start; pFVar4 != pFVar2; pFVar4 = pFVar4 + 1) {
    iVar1 = (pFVar4->ptStart).y;
    if (iVar1 < iVar3 || iVar3 == -1) {
      Finger::operator=(&hf,pFVar4);
      iVar3 = iVar1;
    }
  }
  Finger::operator=(&this->higherFinger,&hf);
  return;
}

Assistant:

void Hand::getHigherFinger() {
    int maxY = -1;
    Finger hf;
    for (Finger &f : fingers) {
        if (maxY == -1 || f.ptStart.y < maxY) {
            maxY = f.ptStart.y;
            hf = f;
        }
    }
    higherFinger = hf;
}